

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

CURLcode Curl_resolver_wait_resolv(connectdata *conn,Curl_dns_entry **entry)

{
  int iVar1;
  CURLcode CVar2;
  Curl_dns_entry *pCVar3;
  
  iVar1 = Curl_thread_join((pthread_t **)(conn->async).os_specific);
  if ((entry == (Curl_dns_entry **)0x0) || (iVar1 == 0)) {
    CVar2 = CURLE_OK;
    (conn->async).done = true;
    if (entry == (Curl_dns_entry **)0x0) {
      pCVar3 = (conn->async).dns;
      CVar2 = CURLE_OK;
      goto LAB_00136898;
    }
  }
  else {
    CVar2 = getaddrinfo_complete(conn);
    (conn->async).done = true;
  }
  pCVar3 = (conn->async).dns;
  *entry = pCVar3;
LAB_00136898:
  if (pCVar3 == (Curl_dns_entry *)0x0) {
    CVar2 = resolver_error(conn);
  }
  destroy_async_data(&conn->async);
  if ((conn->async).dns == (Curl_dns_entry *)0x0) {
    Curl_conncontrol(conn,1);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(conn && td);
  DEBUGASSERT(td->thread_hnd != curl_thread_t_null);

  /* wait for the thread to resolve the name */
  if(Curl_thread_join(&td->thread_hnd)) {
    if(entry)
      result = getaddrinfo_complete(conn);
  }
  else
    DEBUGASSERT(0);

  conn->async.done = TRUE;

  if(entry)
    *entry = conn->async.dns;

  if(!conn->async.dns)
    /* a name was not resolved, report error */
    result = resolver_error(conn);

  destroy_async_data(&conn->async);

  if(!conn->async.dns)
    connclose(conn, "asynch resolve failed");

  return result;
}